

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int iVar1;
  string *psVar2;
  FieldDescriptor *pFVar3;
  FieldDescriptorProto *pFVar4;
  OneofDescriptor *this_00;
  OneofDescriptorProto *proto_00;
  Descriptor *this_01;
  DescriptorProto *proto_01;
  EnumDescriptor *this_02;
  EnumDescriptorProto *proto_02;
  DescriptorProto_ExtensionRange *this_03;
  ExtensionRange *pEVar5;
  DescriptorProto_ReservedRange *this_04;
  ReservedRange *pRVar6;
  MessageOptions *pMVar7;
  MessageOptions *pMVar8;
  int local_4c;
  int i_7;
  ReservedRange *range_1;
  int i_6;
  int i_5;
  ExtensionRange *range;
  int local_28;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *this_local;
  
  psVar2 = name_abi_cxx11_(this);
  DescriptorProto::set_name(proto,psVar2);
  i_2 = 0;
  while( true ) {
    iVar1 = field_count(this);
    if (iVar1 <= i_2) break;
    pFVar3 = field(this,i_2);
    pFVar4 = DescriptorProto::add_field(proto);
    FieldDescriptor::CopyTo(pFVar3,pFVar4);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar1 = oneof_decl_count(this);
    if (iVar1 <= i_3) break;
    this_00 = oneof_decl(this,i_3);
    proto_00 = DescriptorProto::add_oneof_decl(proto);
    OneofDescriptor::CopyTo(this_00,proto_00);
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar1 = nested_type_count(this);
    if (iVar1 <= i_4) break;
    this_01 = nested_type(this,i_4);
    proto_01 = DescriptorProto::add_nested_type(proto);
    CopyTo(this_01,proto_01);
    i_4 = i_4 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar1 = enum_type_count(this);
    if (iVar1 <= local_28) break;
    this_02 = enum_type(this,local_28);
    proto_02 = DescriptorProto::add_enum_type(proto);
    EnumDescriptor::CopyTo(this_02,proto_02);
    local_28 = local_28 + 1;
  }
  range._4_4_ = 0;
  while( true ) {
    iVar1 = extension_range_count(this);
    if (iVar1 <= range._4_4_) break;
    this_03 = DescriptorProto::add_extension_range(proto);
    pEVar5 = extension_range(this,range._4_4_);
    DescriptorProto_ExtensionRange::set_start(this_03,pEVar5->start);
    pEVar5 = extension_range(this,range._4_4_);
    DescriptorProto_ExtensionRange::set_end(this_03,pEVar5->end);
    range._4_4_ = range._4_4_ + 1;
  }
  range_1._4_4_ = 0;
  while( true ) {
    iVar1 = extension_count(this);
    if (iVar1 <= range_1._4_4_) break;
    pFVar3 = extension(this,range_1._4_4_);
    pFVar4 = DescriptorProto::add_extension(proto);
    FieldDescriptor::CopyTo(pFVar3,pFVar4);
    range_1._4_4_ = range_1._4_4_ + 1;
  }
  range_1._0_4_ = 0;
  while( true ) {
    iVar1 = reserved_range_count(this);
    if (iVar1 <= (int)range_1) break;
    this_04 = DescriptorProto::add_reserved_range(proto);
    pRVar6 = reserved_range(this,(int)range_1);
    DescriptorProto_ReservedRange::set_start(this_04,pRVar6->start);
    pRVar6 = reserved_range(this,(int)range_1);
    DescriptorProto_ReservedRange::set_end(this_04,pRVar6->end);
    range_1._0_4_ = (int)range_1 + 1;
  }
  local_4c = 0;
  while( true ) {
    iVar1 = reserved_name_count(this);
    if (iVar1 <= local_4c) break;
    psVar2 = reserved_name_abi_cxx11_(this,local_4c);
    DescriptorProto::add_reserved_name(proto,psVar2);
    local_4c = local_4c + 1;
  }
  pMVar7 = options(this);
  pMVar8 = MessageOptions::default_instance();
  if (pMVar7 != pMVar8) {
    pMVar7 = DescriptorProto::mutable_options(proto);
    pMVar8 = options(this);
    MessageOptions::CopyFrom(pMVar7,pMVar8);
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    DescriptorProto::ExtensionRange* range = proto->add_extension_range();
    range->set_start(extension_range(i)->start);
    range->set_end(extension_range(i)->end);
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}